

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_randomseed(lua_State *L)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  unsigned_long *state;
  lua_Unsigned n1;
  lua_Unsigned n2;
  ulong uVar4;
  ulong uVar5;
  
  state = (unsigned_long *)lua_touserdata(L,-0xf4629);
  iVar2 = lua_type(L,1);
  if (iVar2 == -1) {
    uVar3 = luaL_makeseed(L);
    n1 = (lua_Unsigned)uVar3;
    uVar1 = state[1];
    uVar4 = state[2] ^ *state;
    uVar5 = state[3] ^ uVar1;
    n2 = (uVar1 * 0x280 | uVar1 * 5 >> 0x39) * 9;
    *state = *state ^ uVar5;
    state[1] = uVar4 ^ uVar1;
    state[2] = uVar1 << 0x11 ^ uVar4;
    state[3] = uVar5 << 0x2d | uVar5 >> 0x13;
  }
  else {
    n1 = luaL_checkinteger(L,1);
    n2 = luaL_optinteger(L,2,0);
  }
  setseed(L,state,n1,n2);
  return 2;
}

Assistant:

static int math_randomseed (lua_State *L) {
  RanState *state = (RanState *)lua_touserdata(L, lua_upvalueindex(1));
  lua_Unsigned n1, n2;
  if (lua_isnone(L, 1)) {
    n1 = luaL_makeseed(L);  /* "random" seed */
    n2 = I2UInt(nextrand(state->s));  /* in case seed is not that random... */
  }
  else {
    n1 = l_castS2U(luaL_checkinteger(L, 1));
    n2 = l_castS2U(luaL_optinteger(L, 2, 0));
  }
  setseed(L, state->s, n1, n2);
  return 2;  /* return seeds */
}